

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cutNode.c
# Opt level: O2

int Cut_CutFilterOld(Cut_Man_t *p,Cut_Cut_t *pList,Cut_Cut_t *pCut)

{
  int iVar1;
  Cut_Cut_t *pCVar2;
  Cut_Cut_t *pCVar3;
  Cut_Cut_t **ppCVar4;
  
  pCVar3 = (Cut_Cut_t *)0x0;
  do {
    if (pList == (Cut_Cut_t *)0x0) {
      if (pCVar3->pNext != (Cut_Cut_t *)0x0) {
LAB_003a5fc8:
        __assert_fail("pPrev->pNext == pTemp",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/cut/cutNode.c"
                      ,0x110,"int Cut_CutFilterOld(Cut_Man_t *, Cut_Cut_t *, Cut_Cut_t *)");
      }
      ppCVar4 = &pCVar3->pNext;
      pCVar3 = (Cut_Cut_t *)0x0;
LAB_003a5f99:
      while (pCVar2 = pCVar3, pList != (Cut_Cut_t *)0x0) {
        if (((pCut->uSign & ~pList->uSign) == 0) &&
           (iVar1 = Cut_CutCheckDominance(pCut,pList), iVar1 != 0)) {
          p->nCutsFilter = p->nCutsFilter + 1;
          p->nNodeCuts = p->nNodeCuts + -1;
          *ppCVar4 = pList->pNext;
          Cut_CutRecycle(p,pList);
        }
        else {
          ppCVar4 = &pList->pNext;
        }
        pCVar3 = (Cut_Cut_t *)0x0;
        pList = pCVar2;
        if (pCVar2 != (Cut_Cut_t *)0x0) {
          pCVar3 = pCVar2->pNext;
        }
      }
      if (*ppCVar4 == (Cut_Cut_t *)0x0) {
        return 0;
      }
      __assert_fail("*ppTail == NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/cut/cutNode.c"
                    ,0x129,"int Cut_CutFilterOld(Cut_Man_t *, Cut_Cut_t *, Cut_Cut_t *)");
    }
    if (*(uint *)pCut >> 0x1c < *(uint *)pList >> 0x1c) {
      if (pCVar3->pNext != pList) goto LAB_003a5fc8;
      ppCVar4 = &pCVar3->pNext;
      pCVar3 = pList->pNext;
      goto LAB_003a5f99;
    }
    if (((pList->uSign & ~pCut->uSign) == 0) &&
       (iVar1 = Cut_CutCheckDominance(pList,pCut), iVar1 != 0)) {
      p->nCutsFilter = p->nCutsFilter + 1;
      Cut_CutRecycle(p,pCut);
      return 1;
    }
    pCVar3 = pList;
    pList = pList->pNext;
  } while( true );
}

Assistant:

static inline int Cut_CutFilterOld( Cut_Man_t * p, Cut_Cut_t * pList, Cut_Cut_t * pCut )
{
    Cut_Cut_t * pPrev, * pTemp, * pTemp2, ** ppTail;

    // check if this cut is filtered out by smaller cuts
    pPrev = NULL;
    Cut_ListForEachCut( pList, pTemp )
    {
        if ( pTemp->nLeaves > pCut->nLeaves )
            break;
        pPrev = pTemp;
        // skip the non-contained cuts
        if ( (pTemp->uSign & pCut->uSign) != pTemp->uSign )
            continue;
        // check containment seriously
        if ( Cut_CutCheckDominance( pTemp, pCut ) )
        {
            p->nCutsFilter++;
            Cut_CutRecycle( p, pCut );
            return 1;
        }
    }
    assert( pPrev->pNext == pTemp );

    // filter out other cuts using this one
    ppTail = &pPrev->pNext;
    Cut_ListForEachCutSafe( pTemp, pTemp, pTemp2 )
    {
        // skip the non-contained cuts
        if ( (pTemp->uSign & pCut->uSign) != pCut->uSign )
        {
            ppTail = &pTemp->pNext;
            continue;
        }
        // check containment seriously
        if ( Cut_CutCheckDominance( pCut, pTemp ) )
        {
            p->nCutsFilter++;
            p->nNodeCuts--;
            // skip the given cut in the list
            *ppTail = pTemp->pNext;
            // recycle pTemp
            Cut_CutRecycle( p, pTemp );
        }
        else
            ppTail = &pTemp->pNext;
    }
    assert( *ppTail == NULL );
    return 0;
}